

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_delim_join.cpp
# Opt level: O2

void duckdb::GatherDelimScans
               (PhysicalOperator *op,
               vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> *delim_scans,
               idx_t delim_index)

{
  pointer prVar1;
  PhysicalOperator *in_RAX;
  reference_wrapper<duckdb::PhysicalOperator> *child;
  pointer prVar2;
  PhysicalColumnDataScan *scan;
  reference_wrapper<const_duckdb::PhysicalOperator> local_28;
  
  local_28._M_data = in_RAX;
  if (op->type == DELIM_SCAN) {
    optional_idx::optional_idx((optional_idx *)&local_28,delim_index);
    op[1].children.
    super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_28._M_data;
    local_28._M_data = op;
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator_const>>>
    ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator_const>>
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator_const>>>
                *)delim_scans,&local_28);
  }
  prVar1 = (op->children).
           super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (prVar2 = (op->children).
                super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                ._M_impl.super__Vector_impl_data._M_start; prVar2 != prVar1; prVar2 = prVar2 + 1) {
    GatherDelimScans(prVar2->_M_data,delim_scans,delim_index);
  }
  return;
}

Assistant:

static void GatherDelimScans(PhysicalOperator &op, vector<const_reference<PhysicalOperator>> &delim_scans,
                             idx_t delim_index) {
	if (op.type == PhysicalOperatorType::DELIM_SCAN) {
		auto &scan = op.Cast<PhysicalColumnDataScan>();
		scan.delim_index = optional_idx(delim_index);
		delim_scans.push_back(op);
	}
	for (auto &child : op.children) {
		GatherDelimScans(child, delim_scans, delim_index);
	}
}